

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

string * __thiscall ftxui::Screen::ToString_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  pointer pvVar1;
  Pixel *pPVar2;
  int iVar3;
  long lVar4;
  Pixel *pixel;
  Pixel *next;
  bool bVar5;
  Pixel final_pixel;
  Pixel previous_pixel;
  stringstream ss;
  Pixel local_218;
  Pixel local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Pixel::Pixel(&local_1e8);
  Pixel::Pixel(&local_218);
  if (0 < this->dimy_) {
    lVar4 = 0;
    do {
      if (lVar4 != 0) {
        anon_unknown_0::UpdatePixelStyle((stringstream *)local_1b8,&local_1e8,&local_218);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
      }
      pvVar1 = (this->pixels_).
               super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      next = pvVar1[lVar4].super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
             super__Vector_impl_data._M_start;
      pPVar2 = *(pointer *)
                ((long)&pvVar1[lVar4].
                        super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (next != pPVar2) {
        bVar5 = false;
        do {
          if (!bVar5) {
            anon_unknown_0::UpdatePixelStyle((stringstream *)local_1b8,&local_1e8,next);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(next->character)._M_dataplus._M_p,
                       (next->character)._M_string_length);
          }
          iVar3 = string_width(&next->character);
          bVar5 = iVar3 == 2;
          next = next + 1;
        } while (next != pPVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->dimy_);
  }
  anon_unknown_0::UpdatePixelStyle((stringstream *)local_1b8,&local_1e8,&local_218);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.character._M_dataplus._M_p != &local_218.character.field_2) {
    operator_delete(local_218.character._M_dataplus._M_p,
                    local_218.character.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.character._M_dataplus._M_p != &local_1e8.character.field_2) {
    operator_delete(local_1e8.character._M_dataplus._M_p,
                    local_1e8.character.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ToString() {
  std::stringstream ss;

  Pixel previous_pixel;
  Pixel final_pixel;

  for (int y = 0; y < dimy_; ++y) {
    if (y != 0) {
      UpdatePixelStyle(ss, previous_pixel, final_pixel);
      ss << "\r\n";
    }
    bool previous_fullwidth = false;
    for (const auto& pixel : pixels_[y]) {
      if (!previous_fullwidth) {
        UpdatePixelStyle(ss, previous_pixel, pixel);
        ss << pixel.character;
      }
      previous_fullwidth = (string_width(pixel.character) == 2);
    }
  }

  UpdatePixelStyle(ss, previous_pixel, final_pixel);

  return ss.str();
}